

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

SubscriptPair __thiscall
spvtools::opt::LoopDependenceAnalysis::PropagateConstraints
          (LoopDependenceAnalysis *this,SubscriptPair *subscript_pair,
          vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>
          *constraints)

{
  vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_> *pvVar1;
  bool bVar2;
  int iVar3;
  reference ppCVar4;
  Loop *pLVar5;
  SENode *pSVar6;
  SENode *pSVar7;
  undefined4 extraout_var;
  SENode *pSVar8;
  SENode *operand_2;
  SERecurrentNode *this_00;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> pVar9;
  SubscriptPair SVar10;
  SENode *new_recurrent;
  SERecurrentNode *prime_recurrent;
  SENode *new_child;
  SENode *zeroed_coefficient;
  SENode *rhs;
  DependenceDistance *as_distance;
  SENode *coefficient_of_recurrent_prime;
  SENode *coefficient_of_recurrent;
  Constraint **constraint;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_> *__range2;
  SENode *new_second;
  SENode *new_first;
  vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>
  *constraints_local;
  SubscriptPair *subscript_pair_local;
  LoopDependenceAnalysis *this_local;
  
  new_second = subscript_pair->first;
  __range2 = (vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_> *)
             subscript_pair->second;
  new_first = (SENode *)constraints;
  constraints_local =
       (vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_> *)
       subscript_pair;
  subscript_pair_local = (SubscriptPair *)this;
  __end2 = std::vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>::
           begin(constraints);
  constraint = (Constraint **)
               std::
               vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>::
               end(constraints);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Constraint_*const_*,_std::vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>_>
                                     *)&constraint), bVar2) {
    ppCVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Constraint_*const_*,_std::vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>_>
              ::operator*(&__end2);
    pSVar6 = new_second;
    pLVar5 = Constraint::GetLoop(*ppCVar4);
    pSVar6 = ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm
                       (&this->scalar_evolution_,pSVar6,pLVar5);
    pvVar1 = __range2;
    pLVar5 = Constraint::GetLoop(*ppCVar4);
    pSVar7 = ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm
                       (&this->scalar_evolution_,(SENode *)pvVar1,pLVar5);
    iVar3 = (**(*ppCVar4)->_vptr_Constraint)();
    if (iVar3 == 1) {
      iVar3 = (*(*ppCVar4)->_vptr_Constraint[5])();
      pSVar8 = DependenceDistance::GetDistance((DependenceDistance *)CONCAT44(extraout_var,iVar3));
      operand_2 = ScalarEvolutionAnalysis::CreateMultiplyNode
                            (&this->scalar_evolution_,pSVar6,pSVar8);
      pSVar8 = new_second;
      pLVar5 = Constraint::GetLoop(*ppCVar4);
      pSVar8 = ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm
                         (&this->scalar_evolution_,pSVar8,pLVar5);
      new_second = ScalarEvolutionAnalysis::CreateSubtraction
                             (&this->scalar_evolution_,pSVar8,operand_2);
      new_second = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,new_second);
      pSVar6 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,pSVar7,pSVar6);
      pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar6);
      pvVar1 = __range2;
      pLVar5 = Constraint::GetLoop(*ppCVar4);
      this_00 = ScalarEvolutionAnalysis::GetRecurrentTerm
                          (&this->scalar_evolution_,(SENode *)pvVar1,pLVar5);
      if (this_00 != (SERecurrentNode *)0x0) {
        pLVar5 = Constraint::GetLoop(*ppCVar4);
        pSVar7 = SERecurrentNode::GetOffset(this_00);
        pSVar6 = ScalarEvolutionAnalysis::CreateRecurrentExpression
                           (&this->scalar_evolution_,pLVar5,pSVar7,pSVar6);
        __range2 = (vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>
                    *)ScalarEvolutionAnalysis::UpdateChildNode
                                (&this->scalar_evolution_,(SENode *)__range2,&this_00->super_SENode,
                                 pSVar6);
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Constraint_*const_*,_std::vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>_>
    ::operator++(&__end2);
  }
  __range2 = (vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_> *)
             ScalarEvolutionAnalysis::SimplifyExpression
                       (&this->scalar_evolution_,(SENode *)__range2);
  pVar9 = std::make_pair<spvtools::opt::SENode*&,spvtools::opt::SENode*&>
                    (&new_second,(SENode **)&__range2);
  SVar10.first = pVar9.first;
  SVar10.second = pVar9.second;
  return SVar10;
}

Assistant:

SubscriptPair LoopDependenceAnalysis::PropagateConstraints(
    const SubscriptPair& subscript_pair,
    const std::vector<Constraint*>& constraints) {
  SENode* new_first = subscript_pair.first;
  SENode* new_second = subscript_pair.second;

  for (auto& constraint : constraints) {
    // In the paper this is a[k]. We're extracting the coefficient ('a') of a
    // recurrent expression with respect to the loop 'k'.
    SENode* coefficient_of_recurrent =
        scalar_evolution_.GetCoefficientFromRecurrentTerm(
            new_first, constraint->GetLoop());

    // In the paper this is a'[k].
    SENode* coefficient_of_recurrent_prime =
        scalar_evolution_.GetCoefficientFromRecurrentTerm(
            new_second, constraint->GetLoop());

    if (constraint->GetType() == Constraint::Distance) {
      DependenceDistance* as_distance = constraint->AsDependenceDistance();

      // In the paper this is a[k]*d
      SENode* rhs = scalar_evolution_.CreateMultiplyNode(
          coefficient_of_recurrent, as_distance->GetDistance());

      // In the paper this is a[k] <- 0
      SENode* zeroed_coefficient =
          scalar_evolution_.BuildGraphWithoutRecurrentTerm(
              new_first, constraint->GetLoop());

      // In the paper this is e <- e - a[k]*d.
      new_first = scalar_evolution_.CreateSubtraction(zeroed_coefficient, rhs);
      new_first = scalar_evolution_.SimplifyExpression(new_first);

      // In the paper this is a'[k] - a[k].
      SENode* new_child = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.CreateSubtraction(coefficient_of_recurrent_prime,
                                              coefficient_of_recurrent));

      // In the paper this is a'[k]'i[k].
      SERecurrentNode* prime_recurrent =
          scalar_evolution_.GetRecurrentTerm(new_second, constraint->GetLoop());

      if (!prime_recurrent) continue;

      // As we hash the nodes we need to create a new node when we update a
      // child.
      SENode* new_recurrent = scalar_evolution_.CreateRecurrentExpression(
          constraint->GetLoop(), prime_recurrent->GetOffset(), new_child);
      // In the paper this is a'[k] <- a'[k] - a[k].
      new_second = scalar_evolution_.UpdateChildNode(
          new_second, prime_recurrent, new_recurrent);
    }
  }

  new_second = scalar_evolution_.SimplifyExpression(new_second);
  return std::make_pair(new_first, new_second);
}